

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O0

void highwayhash::MeasureDurations(Func func,DurationsForInputs *input_map,uint8_t *arg)

{
  unsigned_long *__first;
  size_t sVar1;
  anon_class_16_2_4824b9f2 local_af8;
  undefined1 local_ae8 [8];
  DurationSamples samples_1;
  size_t rep;
  DurationsForInputs *local_aa0;
  undefined1 local_a98 [8];
  DurationSamples samples;
  double per_call;
  Inputs inputs;
  allocator<unsigned_long> local_a09;
  undefined1 local_a08 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> distribution;
  undefined1 local_9e8 [4];
  Duration resolution;
  mt19937_64 rng;
  uint8_t *arg_local;
  DurationsForInputs *input_map_local;
  Func func_local;
  
  rng._M_p = (size_t)arg;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)local_9e8);
  distribution.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       anon_unknown_0::Resolution(func,(uint8_t *)rng._M_p);
  __first = input_map->inputs_;
  sVar1 = input_map->num_inputs_;
  std::allocator<unsigned_long>::allocator(&local_a09);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_a08,__first,
             __first + sVar1,&local_a09);
  std::allocator<unsigned_long>::~allocator(&local_a09);
  anon_unknown_0::Inputs::Inputs
            ((Inputs *)&per_call,
             distribution.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a08,func,
             (uint8_t *)rng._M_p,(mt19937_64 *)local_9e8);
  sVar1 = anon_unknown_0::Inputs::NumReplicas((Inputs *)&per_call);
  samples.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)(1.0 / (double)(int)sVar1);
  anon_unknown_0::GatherDurationSamples
            ((DurationSamples *)local_a98,
             distribution.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,(Inputs *)&per_call,func,
             (uint8_t *)rng._M_p,0x200,(mt19937_64 *)local_9e8);
  rep = samples.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_aa0 = input_map;
  (anonymous_namespace)::DurationSamples::
  Reduce<highwayhash::MeasureDurations(unsigned_long(*)(void_const*,unsigned_long),highwayhash::DurationsForInputs*,unsigned_char_const*)::__0>
            ((DurationSamples *)local_a98,(anon_class_16_2_4824b9f2 *)&rep);
  for (samples_1.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_node_count = 1;
      samples_1.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_node_count <
      input_map->max_durations_;
      samples_1.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_node_count =
           samples_1.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    anon_unknown_0::GatherDurationSamples
              ((DurationSamples *)local_ae8,
               distribution.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(Inputs *)&per_call,func,
               (uint8_t *)rng._M_p,0x200,(mt19937_64 *)local_9e8);
    local_af8.per_call =
         (double)samples.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_af8.input_map = input_map;
    (anonymous_namespace)::DurationSamples::
    Reduce<highwayhash::MeasureDurations(unsigned_long(*)(void_const*,unsigned_long),highwayhash::DurationsForInputs*,unsigned_char_const*)::__1>
              ((DurationSamples *)local_ae8,&local_af8);
    anon_unknown_0::DurationSamples::~DurationSamples((DurationSamples *)local_ae8);
  }
  anon_unknown_0::DurationSamples::~DurationSamples((DurationSamples *)local_a98);
  anon_unknown_0::Inputs::~Inputs((Inputs *)&per_call);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a08);
  return;
}

Assistant:

void MeasureDurations(const Func func, DurationsForInputs* input_map,
                      const uint8_t* arg) {
  std::mt19937_64 rng;
  const Duration resolution = Resolution(func, arg);

  // Adds enough 'replicas' of the distribution to measure "func" given
  // the timer resolution.
  const std::vector<FuncInput> distribution(
      input_map->inputs_, input_map->inputs_ + input_map->num_inputs_);
  Inputs inputs(resolution, distribution, func, arg, &rng);
  const double per_call = 1.0 / static_cast<int>(inputs.NumReplicas());

  // First iteration: populate input_map items.
  auto samples =
      GatherDurationSamples(resolution, inputs, func, arg, 512, &rng);
  samples.Reduce(
      [per_call, input_map](const FuncInput input, const Duration duration) {
        const float sample = static_cast<float>(duration * per_call);
        input_map->AddItem(input, sample);
      });

  // Subsequent iteration(s): append to input_map items' array.
  for (size_t rep = 1; rep < input_map->max_durations_; ++rep) {
    auto samples =
        GatherDurationSamples(resolution, inputs, func, arg, 512, &rng);
    samples.Reduce(
        [per_call, input_map](const FuncInput input, const Duration duration) {
          const float sample = static_cast<float>(duration * per_call);
          input_map->AddSample(input, sample);
        });
  }
}